

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

bool __thiscall BackwardPass::ProcessByteCodeUsesInstr(BackwardPass *this,Instr *instr)

{
  StackSym **ppSVar1;
  code *pcVar2;
  bool bVar3;
  RegSlot RVar4;
  SymID id;
  ByteCodeUsesInstr *byteCodeUsesInstr_00;
  BVSparse<Memory::JitArenaAllocator> *pBVar5;
  undefined4 *puVar6;
  StackSym *pSVar7;
  Func *pFVar8;
  PropertySym *propertySymUse;
  RegSlot byteCodeRegSlot;
  StackSym *stackSym;
  SparseBVUnit _unit;
  BVIndex _startIndex;
  BVIndex _offset;
  BVSparseNode<Memory::JitArenaAllocator> *_curNode;
  BVIndex symId;
  BVSparse<Memory::JitArenaAllocator> *byteCodeUpwardExposedUsed_1;
  StackSym *dstStackSym;
  BVSparse<Memory::JitArenaAllocator> *byteCodeUpwardExposedUsed;
  ByteCodeUsesInstr *byteCodeUsesInstr;
  Instr *instr_local;
  BackwardPass *this_local;
  
  bVar3 = IR::Instr::IsByteCodeUsesInstr(instr);
  if (!bVar3) {
    return false;
  }
  byteCodeUsesInstr_00 = IR::Instr::AsByteCodeUsesInstr(instr);
  if (this->tag == BackwardPhase) {
    pBVar5 = ProcessByteCodeUsesSrcs(this,byteCodeUsesInstr_00);
    if (pBVar5 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      BVSparse<Memory::JitArenaAllocator>::Or(this->currentBlock->upwardExposedUses,pBVar5);
    }
  }
  else if (this->tag == CaptureByteCodeRegUsePhase) {
    ProcessByteCodeUsesDst(this,byteCodeUsesInstr_00);
    ProcessByteCodeUsesSrcs(this,byteCodeUsesInstr_00);
  }
  else {
    if (this->tag != DeadStorePhase) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x815,"(tag == Js::DeadStorePhase)","tag == Js::DeadStorePhase");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    if (instr->m_opcode != ByteCodeUses) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x816,"(instr->m_opcode == Js::OpCode::ByteCodeUses)",
                         "instr->m_opcode == Js::OpCode::ByteCodeUses");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    bVar3 = DoMarkTempObjectVerify(this);
    if ((bVar3) &&
       (((*(ushort *)&this->currentBlock->field_0x18 >> 1 & 1) != 0 ||
        ((*(uint *)&this->func->field_0x240 >> 4 & 1) == 0)))) {
      bVar3 = IsCollectionPass(this);
      if (bVar3) {
        if ((*(uint *)&this->func->field_0x240 >> 4 & 1) == 0) {
          return true;
        }
      }
      else {
        ObjectTempVerify::NotifyDeadByteCodeUses
                  (&this->currentBlock->tempObjectVerifyTracker->super_ObjectTempVerify,instr);
      }
    }
    if ((*(uint *)&this->func->field_0x240 >> 4 & 1) != 0) {
      pSVar7 = ProcessByteCodeUsesDst(this,byteCodeUsesInstr_00);
      if ((pSVar7 != (StackSym *)0x0) &&
         (pFVar8 = StackSym::GetByteCodeFunc(pSVar7), pFVar8 == this->func)) {
        ppSVar1 = this->currentBlock->byteCodeRestoreSyms;
        RVar4 = StackSym::GetByteCodeRegSlot(pSVar7);
        ppSVar1[RVar4] = (StackSym *)0x0;
      }
      pBVar5 = ProcessByteCodeUsesSrcs(this,byteCodeUsesInstr_00);
      if (pBVar5 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        for (__startIndex = pBVar5->head; __startIndex != (Type_conflict)0x0;
            __startIndex = __startIndex->next) {
          _unit.word._0_4_ = __startIndex->startIndex;
          stackSym = (StackSym *)(__startIndex->data).word;
          _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&stackSym)
          ;
          while (_unit.word._4_4_ != 0xffffffff) {
            id = (Type)_unit.word + _unit.word._4_4_;
            BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)&stackSym,_unit.word._4_4_);
            pSVar7 = SymTable::FindStackSym(this->func->m_symTable,id);
            bVar3 = StackSym::IsTypeSpec(pSVar7);
            if (bVar3) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar6 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                 ,0x83e,"(!stackSym->IsTypeSpec())","!stackSym->IsTypeSpec()");
              if (!bVar3) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar6 = 0;
            }
            pFVar8 = StackSym::GetByteCodeFunc(pSVar7);
            if (pFVar8 == this->func) {
              RVar4 = StackSym::GetByteCodeRegSlot(pSVar7);
              if (RVar4 == 0xffffffff) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar6 = 1;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                   ,0x843,"(byteCodeRegSlot != Js::Constants::NoRegister)",
                                   "byteCodeRegSlot != Js::Constants::NoRegister");
                if (!bVar3) {
                  pcVar2 = (code *)invalidInstructionException();
                  (*pcVar2)();
                }
                puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar6 = 0;
              }
              if (this->currentBlock->byteCodeRestoreSyms[RVar4] != pSVar7) {
                if (this->currentBlock->byteCodeRestoreSyms[RVar4] != (StackSym *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar6 = 1;
                  bVar3 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                     ,0x847,
                                     "(this->currentBlock->byteCodeRestoreSyms[byteCodeRegSlot] == nullptr)"
                                     ,
                                     "Can\'t have two active lifetime for the same byte code register"
                                    );
                  if (!bVar3) {
                    pcVar2 = (code *)invalidInstructionException();
                    (*pcVar2)();
                  }
                  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar6 = 0;
                }
                this->currentBlock->byteCodeRestoreSyms[RVar4] = pSVar7;
              }
            }
            _unit.word._4_4_ =
                 BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&stackSym);
          }
          if (__startIndex == (Type_conflict)0x0) break;
        }
      }
      bVar3 = IsCollectionPass(this);
      if (bVar3) {
        return true;
      }
      if ((byteCodeUsesInstr_00->propertySymUse != (PropertySym *)0x0) &&
         ((*(ushort *)&this->currentBlock->field_0x18 >> 1 & 1) == 0)) {
        BVSparse<Memory::JitArenaAllocator>::Set
                  (this->currentBlock->upwardExposedFields,
                   (byteCodeUsesInstr_00->propertySymUse->super_Sym).m_id);
      }
      bVar3 = IsPrePass(this);
      if (bVar3) {
        return true;
      }
    }
    BasicBlock::RemoveInstr(this->currentBlock,instr);
  }
  return true;
}

Assistant:

bool
BackwardPass::ProcessByteCodeUsesInstr(IR::Instr * instr)
{
    if (!instr->IsByteCodeUsesInstr())
    {
        return false;
    }

    IR::ByteCodeUsesInstr * byteCodeUsesInstr = instr->AsByteCodeUsesInstr();

    if (this->tag == Js::BackwardPhase)
    {
        // FGPeeps inserts bytecodeuses instrs with srcs.  We need to look at them to set the proper
        // UpwardExposedUsed info and keep the defs alive.
        // The inliner inserts bytecodeuses instrs withs dsts, but we don't want to look at them for upwardExposedUsed
        // as it would cause real defs to look dead.  We use these for bytecodeUpwardExposedUsed info only, which is needed
        // in the dead-store pass only.
        //
        // Handle the source side.
        const BVSparse<JitArenaAllocator>* byteCodeUpwardExposedUsed = ProcessByteCodeUsesSrcs(byteCodeUsesInstr);
        if (byteCodeUpwardExposedUsed != nullptr)
        {
            this->currentBlock->upwardExposedUses->Or(byteCodeUpwardExposedUsed);
        }
    }
#if DBG
    else if (tag == Js::CaptureByteCodeRegUsePhase)
    {
        ProcessByteCodeUsesDst(byteCodeUsesInstr);
        ProcessByteCodeUsesSrcs(byteCodeUsesInstr);
    }
#endif
    else
    {
        Assert(tag == Js::DeadStorePhase);
        Assert(instr->m_opcode == Js::OpCode::ByteCodeUses);
#if DBG
        if (this->DoMarkTempObjectVerify() && (this->currentBlock->isDead || !this->func->hasBailout))
        {
            if (IsCollectionPass())
            {
                if (!this->func->hasBailout)
                {
                    // Prevent byte code uses from being remove on collection pass for mark temp object verify
                    // if we don't have any bailout
                    return true;
                }
            }
            else
            {
                this->currentBlock->tempObjectVerifyTracker->NotifyDeadByteCodeUses(instr);
            }
        }
#endif

        if (this->func->hasBailout)
        {
            // Just collect the byte code uses, and remove the instruction
            // We are going backward, process the dst first and then the src
            StackSym *dstStackSym = ProcessByteCodeUsesDst(byteCodeUsesInstr);
#if DBG
            // We can only track first level function stack syms right now
            if (dstStackSym && dstStackSym->GetByteCodeFunc() == this->func)
            {
                this->currentBlock->byteCodeRestoreSyms[dstStackSym->GetByteCodeRegSlot()] = nullptr;
            }
#endif

            const BVSparse<JitArenaAllocator>* byteCodeUpwardExposedUsed = ProcessByteCodeUsesSrcs(byteCodeUsesInstr);
#if DBG
            if (byteCodeUpwardExposedUsed)
            {
                FOREACH_BITSET_IN_SPARSEBV(symId, byteCodeUpwardExposedUsed)
                {
                    StackSym * stackSym = this->func->m_symTable->FindStackSym(symId);
                    Assert(!stackSym->IsTypeSpec());
                    // We can only track first level function stack syms right now
                    if (stackSym->GetByteCodeFunc() == this->func)
                    {
                        Js::RegSlot byteCodeRegSlot = stackSym->GetByteCodeRegSlot();
                        Assert(byteCodeRegSlot != Js::Constants::NoRegister);
                        if (this->currentBlock->byteCodeRestoreSyms[byteCodeRegSlot] != stackSym)
                        {
                            AssertMsg(this->currentBlock->byteCodeRestoreSyms[byteCodeRegSlot] == nullptr,
                                "Can't have two active lifetime for the same byte code register");
                            this->currentBlock->byteCodeRestoreSyms[byteCodeRegSlot] = stackSym;
                        }
                    }
                }
                NEXT_BITSET_IN_SPARSEBV;
            }
#endif

            if (IsCollectionPass())
            {
                return true;
            }

            PropertySym *propertySymUse = byteCodeUsesInstr->propertySymUse;
            if (propertySymUse && !this->currentBlock->isDead)
            {
                this->currentBlock->upwardExposedFields->Set(propertySymUse->m_id);
            }

            if (this->IsPrePass())
            {
                // Don't remove the instruction yet if we are in the prepass
                // But tell the caller we don't need to process the instruction any more
                return true;
            }
        }

        this->currentBlock->RemoveInstr(instr);
    }